

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeader_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::HttpRequestHeader::ParseLine
          (HttpRequestHeader *this,string *line,int lineNumber)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  string temp;
  
  if (lineNumber != 0) {
    bVar2 = HttpHeader::ParseLine(&this->super_HttpHeader,line,lineNumber);
    return bVar2;
  }
  if (line->_M_string_length != 0) {
    cVar5 = (char)line;
    lVar3 = std::__cxx11::string::find_first_not_of(cVar5,0x20);
    if (lVar3 == -1) {
      return false;
    }
    lVar3 = std::__cxx11::string::find(cVar5,0x20);
    if ((((lVar3 != -1) &&
         (lVar3 = std::__cxx11::string::find_first_not_of(cVar5,0x20), lVar3 != -1)) &&
        (lVar3 = std::__cxx11::string::find(cVar5,0x20), lVar3 != -1)) &&
       (lVar3 = std::__cxx11::string::find_first_not_of(cVar5,0x20), lVar3 != -1)) {
      std::__cxx11::string::substr((ulong)&temp,(ulong)line);
      std::__cxx11::string::operator=((string *)&this->m_method,(string *)&temp);
      std::__cxx11::string::~string((string *)&temp);
      std::__cxx11::string::substr((ulong)&temp,(ulong)line);
      std::__cxx11::string::operator=((string *)&this->m_resource,(string *)&temp);
      std::__cxx11::string::~string((string *)&temp);
      std::__cxx11::string::substr((ulong)&temp,(ulong)line);
      lVar3 = std::__cxx11::string::find((string *)&temp,0x175470);
      if (temp._M_string_length == 8 && lVar3 == 0) {
        pcVar4 = (char *)std::__cxx11::string::at((ulong)&temp);
        cVar5 = *pcVar4;
        pcVar4 = (char *)std::__cxx11::string::at((ulong)&temp);
        cVar1 = *pcVar4;
        (this->super_HttpHeader).m_majorVersion = cVar5 + -0x30;
        (this->super_HttpHeader).m_minorVersion = cVar1 + -0x30;
      }
      std::__cxx11::string::~string((string *)&temp);
      return temp._M_string_length == 8 && lVar3 == 0;
    }
  }
  return false;
}

Assistant:

bool HttpRequestHeader::ParseLine(const string& line, int lineNumber) {

    // if not 'request line', just let base class parse
    if ( lineNumber != 0 )
        return HttpHeader::ParseLine(line, lineNumber);

    // fail if empty line
    if ( line.empty() )
        return false;

    // walk through request line, storing positions
    //    GET /path/to/resource HTTP/1.1
    //    ^  ^^                ^^
    const size_t foundMethod = line.find_first_not_of(Constants::SPACE_CHAR); // skip any leading whitespace
    if ( foundMethod == string::npos ) return false;
    const size_t foundFirstSpace = line.find(Constants::SPACE_CHAR, foundMethod+1);
    if ( foundFirstSpace == string::npos ) return false;
    const size_t foundResource = line.find_first_not_of(Constants::SPACE_CHAR, foundFirstSpace+1);
    if ( foundResource == string::npos ) return false;
    const size_t foundSecondSpace = line.find(Constants::SPACE_CHAR, foundResource+1);
    if ( foundSecondSpace == string::npos ) return false;
    const size_t foundVersion= line.find_first_not_of(Constants::SPACE_CHAR, foundSecondSpace+1);
    if ( foundVersion == string::npos ) return false;

    // parse out method & resource
    m_method   = line.substr(foundMethod,   foundFirstSpace  - foundMethod);
    m_resource = line.substr(foundResource, foundSecondSpace - foundResource);

    // parse out version numbers
    const string temp = line.substr(foundVersion);
    if ( (temp.find(Constants::HTTP_STRING) != 0) || (temp.size() != 8) )
        return false;
    const int major = static_cast<int>(temp.at(5) - '0');
    const int minor = static_cast<int>(temp.at(7) - '0');
    SetVersion(major, minor);

    // if we get here, return success
    return true;
}